

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O2

ssize_t cf_h2_proxy_recv(Curl_cfilter *cf,Curl_easy *data,char *buf,size_t len,CURLcode *err)

{
  uint32_t error_code;
  uint uVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  void *pvVar4;
  void *pvVar5;
  _Bool _Var6;
  byte bVar7;
  CURLcode CVar8;
  size_t size;
  char *pcVar9;
  
  puVar2 = (undefined8 *)cf->ctx;
  if (*(int *)(puVar2 + 0x26) != 3) {
    *err = CURLE_RECV_ERROR;
    return -1;
  }
  uVar3 = puVar2[1];
  puVar2[1] = data;
  _Var6 = Curl_bufq_is_empty((bufq *)(puVar2 + 0x13));
  if (_Var6) {
    CVar8 = proxy_h2_progress_ingress(cf,data);
    *err = CVar8;
    if (CVar8 != CURLE_OK) {
      size = 0xffffffffffffffff;
      goto LAB_00514dca;
    }
  }
  pvVar4 = cf->ctx;
  *err = CURLE_AGAIN;
  _Var6 = Curl_bufq_is_empty((bufq *)((long)pvVar4 + 0x98));
  if (_Var6) {
    CVar8 = CURLE_RECV_ERROR;
    if ((*(byte *)((long)pvVar4 + 0x134) & 2) == 0) {
      if ((*(byte *)((long)pvVar4 + 0x134) & 4) == 0) {
        bVar7 = *(byte *)((long)pvVar4 + 0x140);
        if ((bVar7 & 1) != 0) {
          _Var6 = Curl_bufq_is_empty((bufq *)((long)pvVar4 + 0x10));
          if (_Var6) goto LAB_00514cb3;
          bVar7 = *(byte *)((long)pvVar4 + 0x140);
        }
        size = 0xffffffffffffffff;
        if (((bVar7 & 2) == 0) || (*(int *)((long)pvVar4 + 0x120) <= *(int *)((long)pvVar4 + 0x13c))
           ) goto LAB_00514cba;
      }
LAB_00514cb3:
      *err = CVar8;
      size = 0xffffffffffffffff;
      goto LAB_00514cba;
    }
    pvVar5 = cf->ctx;
    error_code = *(uint32_t *)((long)pvVar5 + 0x124);
    if (error_code != 0) {
      if (error_code == 7) {
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
           (0 < cf->cft->log_level)) {
          Curl_trc_cf_infof(data,cf,"[%d] REFUSED_STREAM, try again on a new connection",
                            (ulong)*(uint *)((long)pvVar5 + 0x120));
        }
        Curl_conncontrol(cf->conn,1);
      }
      else {
        uVar1 = *(uint *)((long)pvVar5 + 0x120);
        pcVar9 = nghttp2_http2_strerror(error_code);
        Curl_failf(data,"HTTP/2 stream %u was not closed cleanly: %s (err %u)",(ulong)uVar1,pcVar9,
                   (ulong)*(uint *)((long)pvVar5 + 0x124));
        CVar8 = CURLE_HTTP2_STREAM;
      }
      goto LAB_00514cb3;
    }
    if ((*(byte *)((long)pvVar5 + 0x134) & 4) != 0) {
      Curl_failf(data,"HTTP/2 stream %u was reset",(ulong)*(uint *)((long)pvVar5 + 0x120));
      goto LAB_00514cb3;
    }
    *err = CURLE_OK;
    if (data == (Curl_easy *)0x0) {
      size = 0;
      goto LAB_00514d65;
    }
    if ((((data->set).field_0x8bd & 0x10) == 0) || (cf->cft->log_level < 1)) {
      size = 0;
    }
    else {
      size = 0;
      Curl_trc_cf_infof(data,cf,"[%d] handle_tunnel_close -> %zd, %d",
                        (ulong)*(uint *)((long)pvVar5 + 0x120),0,0);
    }
LAB_00514cc8:
    if ((((data->set).field_0x8bd & 0x10) != 0) && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"[%d] tunnel_recv(len=%zu) -> %zd, %d",
                        (ulong)*(uint *)((long)pvVar4 + 0x120),len,size,*err);
    }
    if (0 < (long)size) {
      if ((((data->set).field_0x8bd & 0x10) != 0) && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"[%d] increase window by %zd",(ulong)*(uint *)(puVar2 + 0x24),size
                         );
      }
LAB_00514d4f:
      nghttp2_session_consume((nghttp2_session *)*puVar2,*(int32_t *)(puVar2 + 0x24),size);
    }
  }
  else {
    size = Curl_bufq_read((bufq *)((long)pvVar4 + 0x98),(uchar *)buf,len,err);
    if (size == 0) {
      CVar8 = CURLE_AGAIN;
      goto LAB_00514cb3;
    }
LAB_00514cba:
    if (data != (Curl_easy *)0x0) goto LAB_00514cc8;
    if (0 < (long)size) goto LAB_00514d4f;
  }
LAB_00514d65:
  CVar8 = proxy_h2_progress_egress(cf,data);
  if (CVar8 != CURLE_OK) {
    if (CVar8 == CURLE_AGAIN) {
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
         (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"[%d] egress blocked, DRAIN",(ulong)*(uint *)(puVar2 + 0x24));
      }
      drain_tunnel(cf,data,(tunnel_stream *)(puVar2 + 0x12));
    }
    else {
      *err = CVar8;
      size = 0xffffffffffffffff;
    }
  }
LAB_00514dca:
  _Var6 = Curl_bufq_is_empty((bufq *)(puVar2 + 0x13));
  if ((!_Var6) && ((-1 < (long)size || (*err == CURLE_AGAIN)))) {
    drain_tunnel(cf,data,(tunnel_stream *)(puVar2 + 0x12));
  }
  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
     (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"[%d] cf_recv(len=%zu) -> %zd %d",(ulong)*(uint *)(puVar2 + 0x24),len,
                      size,*err);
  }
  *(undefined8 *)((long)cf->ctx + 8) = uVar3;
  return size;
}

Assistant:

static ssize_t cf_h2_proxy_recv(struct Curl_cfilter *cf,
                                struct Curl_easy *data,
                                char *buf, size_t len, CURLcode *err)
{
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  ssize_t nread = -1;
  struct cf_call_data save;
  CURLcode result;

  if(ctx->tunnel.state != H2_TUNNEL_ESTABLISHED) {
    *err = CURLE_RECV_ERROR;
    return -1;
  }
  CF_DATA_SAVE(save, cf, data);

  if(Curl_bufq_is_empty(&ctx->tunnel.recvbuf)) {
    *err = proxy_h2_progress_ingress(cf, data);
    if(*err)
      goto out;
  }

  nread = tunnel_recv(cf, data, buf, len, err);

  if(nread > 0) {
    CURL_TRC_CF(data, cf, "[%d] increase window by %zd",
                ctx->tunnel.stream_id, nread);
    nghttp2_session_consume(ctx->h2, ctx->tunnel.stream_id, (size_t)nread);
  }

  result = proxy_h2_progress_egress(cf, data);
  if(result == CURLE_AGAIN) {
    /* pending data to send, need to be called again. Ideally, we'd
     * monitor the socket for POLLOUT, but we might not be in SENDING
     * transfer state any longer and are unable to make this happen.
     */
    CURL_TRC_CF(data, cf, "[%d] egress blocked, DRAIN",
                ctx->tunnel.stream_id);
    drain_tunnel(cf, data, &ctx->tunnel);
  }
  else if(result) {
    *err = result;
    nread = -1;
  }

out:
  if(!Curl_bufq_is_empty(&ctx->tunnel.recvbuf) &&
     (nread >= 0 || *err == CURLE_AGAIN)) {
    /* data pending and no fatal error to report. Need to trigger
     * draining to avoid stalling when no socket events happen. */
    drain_tunnel(cf, data, &ctx->tunnel);
  }
  CURL_TRC_CF(data, cf, "[%d] cf_recv(len=%zu) -> %zd %d",
              ctx->tunnel.stream_id, len, nread, *err);
  CF_DATA_RESTORE(cf, save);
  return nread;
}